

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_reply.c
# Opt level: O1

int tnt_reply_body0(tnt_reply *r,char *buf,size_t size,size_t *off)

{
  ushort *puVar1;
  byte bVar2;
  char cVar3;
  ulong uVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  char ********ppppppppcVar8;
  long lVar9;
  size_t size_00;
  ulong uVar10;
  char ********end;
  tnt_reply *r_00;
  ulong uVar11;
  char ********ppppppppcVar12;
  char ********ppppppppcStack_f0;
  char *******pppppppcStack_e8;
  char *******pppppppcStack_d8;
  char *******pppppppcStack_d0;
  ulong uStack_c8;
  size_t *psStack_c0;
  char ********ppppppppcStack_b8;
  code *pcStack_b0;
  char *local_a0;
  char *test;
  char *local_90;
  tnt_reply *local_88;
  char ********local_80;
  char ********local_78;
  char ********local_70;
  char ********local_68;
  char ********local_60;
  char ********local_58;
  char ********local_50;
  char ********local_48;
  ulong local_40;
  char ********local_38;
  char *p;
  
  end = (char ********)(buf + size);
  pcStack_b0 = (code *)0x104fd9;
  local_a0 = buf;
  local_38 = (char ********)buf;
  iVar6 = mp_check(&local_a0,(char *)end);
  r_00 = (tnt_reply *)0xffffffff;
  if (iVar6 != 0) {
LAB_0010551c:
    return (int)r_00;
  }
  bVar2 = *(byte *)local_38;
  uVar10 = (ulong)bVar2;
  if (mp_type_hint[uVar10] != MP_MAP) goto LAB_0010551c;
  ppppppppcVar8 = (char ********)((long)local_38 + 1);
  test = (char *)off;
  local_90 = buf;
  local_88 = r;
  if (bVar2 == 0xdf) {
    uVar7 = *(uint *)((long)local_38 + 1);
    uVar10 = (ulong)(uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18
                    );
    local_38 = (char ********)((long)local_38 + 5);
  }
  else if (bVar2 == 0xde) {
    uVar10 = (ulong)(ushort)(*(ushort *)((long)local_38 + 1) << 8 |
                            *(ushort *)((long)local_38 + 1) >> 8);
    local_38 = (char ********)((long)local_38 + 3);
  }
  else {
    local_38 = ppppppppcVar8;
    if (-0x71 < (char)bVar2) {
LAB_00105537:
      pcStack_b0 = tnt_reply;
      tnt_reply_body0_cold_3();
      uStack_c8 = uVar10;
      psStack_c0 = off;
      ppppppppcStack_b8 = (char ********)buf;
      pcStack_b0 = (code *)&stack0xfffffffffffffff8;
      iVar6 = tnt_reply_len((char *)end,size_00,(size_t *)&pppppppcStack_d0);
      pppppppcStack_d8 = pppppppcStack_d0;
      if (iVar6 == 0) {
        if (r_00 == (tnt_reply *)0x0) {
          iVar6 = 0;
        }
        else {
          pppppppcStack_e8 = (char *******)&pppppppcStack_d8;
          pppppppcStack_d8 = (char *******)0x0;
          ppppppppcStack_f0 = end;
          iVar6 = tnt_reply_from(r_00,tnt_reply_cb,&ppppppppcStack_f0);
        }
      }
      else {
        if (iVar6 != 1) {
          return -1;
        }
        iVar6 = 1;
      }
      if (ppppppppcVar8 != (char ********)0x0) {
        *ppppppppcVar8 = pppppppcStack_d8;
      }
      return iVar6;
    }
    uVar10 = (ulong)(bVar2 & 0xf);
  }
  local_50 = (char ********)0x0;
  local_48 = (char ********)0x0;
  local_68 = (char ********)0x0;
  local_80 = (char ********)0x0;
  local_60 = (char ********)0x0;
  local_78 = (char ********)0x0;
  local_58 = (char ********)0x0;
  local_70 = (char ********)0x0;
  uVar11 = 0;
LAB_001050ae:
  r_00 = (tnt_reply *)0xffffffff;
  iVar6 = (int)uVar10;
  uVar10 = (ulong)(iVar6 - 1);
  if (iVar6 == 0) {
    if (local_88 != (tnt_reply *)0x0) {
      local_88->error = (char *)local_50;
      local_88->error_end = (char *)local_48;
      local_88->data = (char *)local_68;
      local_88->data_end = (char *)local_80;
      local_88->metadata = (char *)local_60;
      local_88->metadata_end = (char *)local_78;
      local_88->sqlinfo = (char *)local_58;
      local_88->sqlinfo_end = (char *)local_70;
      local_88->bitmap = local_88->bitmap | uVar11;
    }
    r_00 = (tnt_reply *)0x0;
    if (test != (char *)0x0) {
      *(long *)test = (long)local_38 - (long)local_90;
    }
    goto LAB_0010551c;
  }
  bVar2 = *(byte *)local_38;
  off = (size_t *)(ulong)bVar2;
  ppppppppcVar12 = (char ********)((long)local_38 + 1);
  ppppppppcVar8 = (char ********)(ulong)(bVar2 - 0xcc);
  switch(ppppppppcVar8) {
  case (char ********)0x0:
    off = (size_t *)(ulong)*(byte *)((long)local_38 + 1);
    local_38 = (char ********)((long)local_38 + 2);
    break;
  case (char ********)0x1:
    puVar1 = (ushort *)((long)local_38 + 1);
    local_38 = (char ********)((long)local_38 + 3);
    off = (size_t *)(ulong)(ushort)(*puVar1 << 8 | *puVar1 >> 8);
    break;
  case (char ********)0x2:
    uVar7 = *(uint *)((long)local_38 + 1);
    off = (size_t *)
          (ulong)(uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18);
    local_38 = (char ********)((long)local_38 + 5);
    break;
  case (char ********)0x3:
    uVar4 = *(ulong *)((long)local_38 + 1);
    off = (size_t *)
          (uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18 |
           (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18 |
           (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38);
    local_38 = (char ********)((long)local_38 + 9);
    break;
  default:
    local_38 = ppppppppcVar12;
    if (-1 < (char)bVar2) break;
    pcStack_b0 = (code *)0x105532;
    tnt_reply_body0_cold_2();
    goto LAB_00105532;
  }
  ppppppppcVar8 = local_38;
  iVar6 = (int)off;
  if (iVar6 < 0x32) {
    if (iVar6 == 0x30) {
      if (mp_type_hint[*(byte *)local_38] == MP_ARRAY) {
        ppppppppcVar12 = (char ********)0x1;
        do {
          end = (char ********)((long)local_38 + 1);
          cVar3 = ""[*(byte *)local_38];
          lVar9 = (long)cVar3;
          if (lVar9 < 0) {
            if (*(byte *)local_38 == 0xd9) {
              local_38 = (char ********)((long)local_38 + (ulong)*(byte *)((long)local_38 + 1) + 2);
              goto LAB_00105314;
            }
            local_40 = uVar11;
            if (cVar3 < -0x1f) {
              pcStack_b0 = (code *)0x105365;
              end = ppppppppcVar12;
              mp_next_slowpath((char **)&local_38,(int64_t)ppppppppcVar12);
            }
            else {
              ppppppppcVar12 = (char ********)((long)ppppppppcVar12 - lVar9);
              local_38 = end;
            }
            bVar5 = cVar3 >= -0x1f;
            uVar11 = local_40;
          }
          else {
            end = (char ********)((long)end + lVar9);
            local_38 = end;
LAB_00105314:
            bVar5 = true;
          }
        } while ((bVar5) &&
                (bVar5 = 1 < (long)ppppppppcVar12,
                ppppppppcVar12 = (char ********)((long)ppppppppcVar12 + -1), bVar5));
        local_80 = local_38;
        local_68 = ppppppppcVar8;
        goto LAB_001054a0;
      }
LAB_0010542a:
      bVar5 = false;
      goto LAB_001054a6;
    }
    if (iVar6 == 0x31) {
      bVar2 = *(byte *)local_38;
      ppppppppcVar8 = (char ********)buf;
      if (mp_type_hint[bVar2] != MP_STR) goto LAB_0010542a;
      ppppppppcVar12 = (char ********)((long)local_38 + 1);
      if (bVar2 == 0xdb) {
        uVar7 = *(uint *)((long)local_38 + 1);
        uVar7 = uVar7 >> 0x18 | (uVar7 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | uVar7 << 0x18;
        local_38 = (char ********)((long)local_38 + 5);
      }
      else if (bVar2 == 0xda) {
        puVar1 = (ushort *)((long)local_38 + 1);
        local_38 = (char ********)((long)local_38 + 3);
        uVar7 = (uint)(ushort)(*puVar1 << 8 | *puVar1 >> 8);
      }
      else if (bVar2 == 0xd9) {
        uVar7 = (uint)*(byte *)((long)local_38 + 1);
        local_38 = (char ********)((long)local_38 + 2);
      }
      else {
        ppppppppcVar8 = (char ********)(ulong)(bVar2 + 0x40);
        local_38 = ppppppppcVar12;
        if ((byte)(bVar2 + 0x40) < 0xe0) {
LAB_00105532:
          pcStack_b0 = (code *)0x105537;
          tnt_reply_body0_cold_1();
          goto LAB_00105537;
        }
        uVar7 = bVar2 & 0x1f;
      }
      local_50 = local_38;
      local_48 = (char ********)((ulong)uVar7 + (long)local_38);
      ppppppppcVar8 = (char ********)buf;
      local_38 = local_48;
      goto LAB_001054a0;
    }
LAB_00105243:
    ppppppppcVar12 = (char ********)0x1;
    ppppppppcVar8 = (char ********)buf;
    do {
      end = (char ********)((long)local_38 + 1);
      cVar3 = ""[*(byte *)local_38];
      lVar9 = (long)cVar3;
      if (lVar9 < 0) {
        if (*(byte *)local_38 == 0xd9) {
          local_38 = (char ********)((long)local_38 + (ulong)*(byte *)((long)local_38 + 1) + 2);
          goto LAB_00105269;
        }
        local_40 = uVar11;
        if (cVar3 < -0x1f) {
          pcStack_b0 = (code *)0x1052bd;
          end = ppppppppcVar12;
          mp_next_slowpath((char **)&local_38,(int64_t)ppppppppcVar12);
          ppppppppcVar8 = (char ********)&local_38;
        }
        else {
          ppppppppcVar12 = (char ********)((long)ppppppppcVar12 - lVar9);
          local_38 = end;
        }
        bVar5 = cVar3 >= -0x1f;
        uVar11 = local_40;
      }
      else {
        end = (char ********)((long)end + lVar9);
        local_38 = end;
LAB_00105269:
        bVar5 = true;
      }
    } while ((bVar5) &&
            (bVar5 = 1 < (long)ppppppppcVar12,
            ppppppppcVar12 = (char ********)((long)ppppppppcVar12 + -1), bVar5));
  }
  else if (iVar6 == 0x32) {
    if (mp_type_hint[*(byte *)local_38] != MP_ARRAY) goto LAB_0010542a;
    ppppppppcVar12 = (char ********)0x1;
    do {
      end = (char ********)((long)local_38 + 1);
      cVar3 = ""[*(byte *)local_38];
      lVar9 = (long)cVar3;
      if (lVar9 < 0) {
        if (*(byte *)local_38 == 0xd9) {
          local_38 = (char ********)((long)local_38 + (ulong)*(byte *)((long)local_38 + 1) + 2);
          goto LAB_001053bd;
        }
        local_40 = uVar11;
        if (cVar3 < -0x1f) {
          pcStack_b0 = (code *)0x10540b;
          end = ppppppppcVar12;
          mp_next_slowpath((char **)&local_38,(int64_t)ppppppppcVar12);
        }
        else {
          ppppppppcVar12 = (char ********)((long)ppppppppcVar12 - lVar9);
          local_38 = end;
        }
        bVar5 = cVar3 >= -0x1f;
        uVar11 = local_40;
      }
      else {
        end = (char ********)((long)end + lVar9);
        local_38 = end;
LAB_001053bd:
        bVar5 = true;
      }
    } while ((bVar5) &&
            (bVar5 = 1 < (long)ppppppppcVar12,
            ppppppppcVar12 = (char ********)((long)ppppppppcVar12 + -1), bVar5));
    local_78 = local_38;
    local_60 = ppppppppcVar8;
  }
  else {
    if (iVar6 != 0x42) goto LAB_00105243;
    if (mp_type_hint[*(byte *)local_38] != MP_MAP) goto LAB_0010542a;
    ppppppppcVar12 = (char ********)0x1;
    do {
      end = (char ********)((long)local_38 + 1);
      cVar3 = ""[*(byte *)local_38];
      lVar9 = (long)cVar3;
      if (lVar9 < 0) {
        if (*(byte *)local_38 == 0xd9) {
          local_38 = (char ********)((long)local_38 + (ulong)*(byte *)((long)local_38 + 1) + 2);
          goto LAB_001051d3;
        }
        local_40 = uVar11;
        if (cVar3 < -0x1f) {
          pcStack_b0 = (code *)0x105224;
          end = ppppppppcVar12;
          mp_next_slowpath((char **)&local_38,(int64_t)ppppppppcVar12);
        }
        else {
          ppppppppcVar12 = (char ********)((long)ppppppppcVar12 - lVar9);
          local_38 = end;
        }
        bVar5 = cVar3 >= -0x1f;
        uVar11 = local_40;
      }
      else {
        end = (char ********)((long)end + lVar9);
        local_38 = end;
LAB_001051d3:
        bVar5 = true;
      }
    } while ((bVar5) &&
            (bVar5 = 1 < (long)ppppppppcVar12,
            ppppppppcVar12 = (char ********)((long)ppppppppcVar12 + -1), bVar5));
    local_70 = local_38;
    local_58 = ppppppppcVar8;
  }
LAB_001054a0:
  uVar11 = uVar11 | 1L << ((ulong)off & 0x3f);
  bVar5 = true;
LAB_001054a6:
  r_00 = (tnt_reply *)0xffffffff;
  buf = (char *)ppppppppcVar8;
  if (!bVar5) goto LAB_0010551c;
  goto LAB_001050ae;
}

Assistant:

int
tnt_reply_body0(struct tnt_reply *r, const char *buf, size_t size, size_t *off) {
	const char *test = buf;
	const char *p = buf;
	if (mp_check(&test, p + size))
		return -1;
	if (mp_typeof(*p) != MP_MAP)
		return -1;
	const char *error = NULL, *error_end = NULL,
		   *data = NULL, *data_end = NULL,
		   *metadata = NULL, *metadata_end = NULL,
		   *sqlinfo = NULL, *sqlinfo_end = NULL;
	uint64_t bitmap = 0;
	uint32_t n = mp_decode_map(&p);
	while (n-- > 0) {
		uint32_t key = mp_decode_uint(&p);
		switch (key) {
		case TNT_ERROR: {
			if (mp_typeof(*p) != MP_STR)
				return -1;
			uint32_t elen = 0;
			error = mp_decode_str(&p, &elen);
			error_end = error + elen;
			break;
		}
		case TNT_DATA: {
			if (mp_typeof(*p) != MP_ARRAY)
				return -1;
			data = p;
			mp_next(&p);
			data_end = p;
			break;
		}
		case TNT_METADATA: {
			if (mp_typeof(*p) != MP_ARRAY)
				return -1;
			metadata = p;
			mp_next(&p);
			metadata_end = p;
			break;
		}
		case TNT_SQL_INFO: {
			if (mp_typeof(*p) != MP_MAP)
				return -1;
			sqlinfo = p;
			mp_next(&p);
			sqlinfo_end = p;
			break;
		}
		default: {
			mp_next(&p);
			break;
		}
		}
		bitmap |= (1ULL << key);
	}
	if (r) {
		r->error = error;
		r->error_end = error_end;
		r->data = data;
		r->data_end = data_end;
		r->metadata = metadata;
		r->metadata_end = metadata_end;
		r->sqlinfo = sqlinfo;
		r->sqlinfo_end = sqlinfo_end;
		r->bitmap |= bitmap;
	}
	if (off)
		*off = p - buf;
	return 0;
}